

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManPrintInit(Nf_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  if (p->pPars->fVerbose != 0) {
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)p->pPars->nRounds);
    printf("Coarse = %d   ",(ulong)(uint)p->pPars->fCoarsen);
    printf("Cells = %d  ",(ulong)(uint)p->nCells);
    printf("Funcs = %d  ",(ulong)(uint)p->vTtMem->nEntries);
    lVar3 = (long)p->vTt2Match->nSize;
    uVar6 = 0;
    if (0 < lVar3) {
      lVar7 = 0;
      iVar4 = 0;
      do {
        iVar4 = iVar4 + *(int *)((long)&p->vTt2Match->pArray->nSize + lVar7);
        lVar7 = lVar7 + 0x10;
      } while (lVar3 * 0x10 != lVar7);
      uVar6 = (ulong)(uint)(iVar4 / 2);
    }
    printf("Matches = %d  ",uVar6);
    pGVar1 = p->pGia;
    printf("And = %d  ",(ulong)(uint)(~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + pGVar1->nObjs))
    ;
    piVar2 = p->pGia->pSibls;
    uVar5 = 0;
    if ((piVar2 != (int *)0x0) && (lVar3 = (long)p->pGia->nObjs, uVar5 = 0, 0 < lVar3)) {
      lVar7 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 + (0 < piVar2[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar3 != lVar7);
    }
    if (uVar5 != 0) {
      printf("Choices = %d  ",(ulong)uVar5);
    }
    putchar(10);
    printf("Computing cuts...\r");
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Nf_ManPrintInit( Nf_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds );//+ p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    printf( "Cells = %d  ",   p->nCells );
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    printf( "Matches = %d  ", Vec_WecSizeSize(p->vTt2Match)/2 );
    printf( "And = %d  ",     Gia_ManAndNum(p->pGia) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}